

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
* __thiscall
libtorrent::aux::piece_picker::get_download_queue
          (vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
           *__return_storage_ptr__,piece_picker *this)

{
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_50;
  const_iterator local_48;
  vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  *local_40;
  value_type *c;
  const_iterator __end2;
  const_iterator __begin2;
  array<aux::vector<downloading_piece>,_static_cast<std::uint8_t>(piece_pos::num_download_categories),_download_queue_t>
  *__range2;
  piece_picker *local_18;
  piece_picker *this_local;
  vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  *ret;
  
  __range2._7_1_ = 0;
  local_18 = this;
  this_local = (piece_picker *)__return_storage_ptr__;
  ::std::
  vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  ::vector(__return_storage_ptr__);
  __begin2 = (const_iterator)&this->m_downloads;
  __end2 = ::std::
           array<libtorrent::aux::container_wrapper<libtorrent::aux::piece_picker::downloading_piece,_int,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>,_4UL>
           ::begin((array<libtorrent::aux::container_wrapper<libtorrent::aux::piece_picker::downloading_piece,_int,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>,_4UL>
                    *)__begin2);
  c = ::std::
      array<libtorrent::aux::container_wrapper<libtorrent::aux::piece_picker::downloading_piece,_int,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>,_4UL>
      ::end((array<libtorrent::aux::container_wrapper<libtorrent::aux::piece_picker::downloading_piece,_int,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>,_4UL>
             *)__begin2);
  for (; __end2 != c; __end2 = __end2 + 1) {
    local_40 = &__end2->
                super_vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
    ;
    local_50._M_current =
         (downloading_piece *)
         ::std::
         vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_const*,std::vector<libtorrent::aux::piece_picker::downloading_piece,std::allocator<libtorrent::aux::piece_picker::downloading_piece>>>
    ::__normal_iterator<libtorrent::aux::piece_picker::downloading_piece*>
              ((__normal_iterator<libtorrent::aux::piece_picker::downloading_piece_const*,std::vector<libtorrent::aux::piece_picker::downloading_piece,std::allocator<libtorrent::aux::piece_picker::downloading_piece>>>
                *)&local_48,&local_50);
    __first = ::std::
              vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
              ::begin(local_40);
    __last = ::std::
             vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
             ::end(local_40);
    ::std::
    vector<libtorrent::aux::piece_picker::downloading_piece,std::allocator<libtorrent::aux::piece_picker::downloading_piece>>
    ::
    insert<__gnu_cxx::__normal_iterator<libtorrent::aux::piece_picker::downloading_piece_const*,std::vector<libtorrent::aux::piece_picker::downloading_piece,std::allocator<libtorrent::aux::piece_picker::downloading_piece>>>,void>
              ((vector<libtorrent::aux::piece_picker::downloading_piece,std::allocator<libtorrent::aux::piece_picker::downloading_piece>>
                *)__return_storage_ptr__,local_48,
               (__normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
                )__first._M_current,
               (__normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
                )__last._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<piece_picker::downloading_piece> piece_picker::get_download_queue() const
	{
#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif

		std::vector<downloading_piece> ret;
		for (auto const& c : m_downloads)
			ret.insert(ret.end(), c.begin(), c.end());
		return ret;
	}